

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O1

void __thiscall rank::Rank::add(Rank *this,KeyValue *kv)

{
  Value *pVVar1;
  pointer *ppEVar2;
  Key key;
  iterator __position;
  pointer pEVar3;
  pointer pEVar4;
  long lVar5;
  Entry *pEVar6;
  ulong uVar7;
  Entry local_38;
  
  key = kv->_key;
  pEVar6 = find(this,key);
  if (pEVar6 == (Entry *)0x0) {
    local_38._key_value._value = kv->_value;
    local_38._order = 0;
    __position._M_current =
         (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_38._key_value._key = key;
    if (__position._M_current ==
        (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<rank::Entry,_std::allocator<rank::Entry>_>::_M_realloc_insert<rank::Entry>
                (&this->_entries,__position,&local_38);
    }
    else {
      (__position._M_current)->_order = 0;
      ((__position._M_current)->_key_value)._key = key;
      ((__position._M_current)->_key_value)._value = local_38._key_value._value;
      ppEVar2 = &(this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppEVar2 = *ppEVar2 + 1;
    }
  }
  else {
    pVVar1 = &(pEVar6->_key_value)._value;
    *pVVar1 = *pVVar1 + kv->_value;
  }
  pEVar3 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar4 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar4) {
    uVar7 = ((long)pEVar4 - (long)pEVar3 >> 3) * -0x5555555555555555;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar3,pEVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar3,pEVar4);
  }
  this->_dirty = true;
  return;
}

Assistant:

void Rank::add(const KeyValue& kv) {
        auto r = find(kv.key());
        if (!r) {
            _entries.push_back(Entry{kv});
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
        else {
            r->key_value().value_add(kv.value());
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
    }